

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

void TTD::NSTokens::CleanupKeyNamesArray(char16 ***names,size_t **lengths)

{
  if (*names != (char16 **)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,*names,0x3c0);
    *names = (char16 **)0x0;
  }
  if (*lengths != (size_t *)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,*lengths,0x3c0);
    *lengths = (size_t *)0x0;
  }
  return;
}

Assistant:

void CleanupKeyNamesArray(const char16*** names, size_t** lengths)
        {
            if(*names != nullptr)
            {
                TT_HEAP_FREE_ARRAY(char16*, *names, (uint32)NSTokens::Key::Count);
                *names = nullptr;
            }

            if(*lengths != nullptr)
            {
                TT_HEAP_FREE_ARRAY(size_t, *lengths, (uint32)NSTokens::Key::Count);
                *lengths = nullptr;
            }
        }